

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix2f> *value)

{
  bool bVar1;
  matrix2f v;
  matrix2f local_20;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_20.m[0][0] = 1.0;
    local_20.m[0][1] = 0.0;
    local_20.m[1][0] = 0.0;
    local_20.m[1][1] = 1.0;
    bVar1 = ParseMatrix(this,&local_20);
    if (bVar1) {
      *(float (*) [2])&value->contained = local_20.m[0];
      *(float (*) [2])((long)&value->contained + 8) = local_20.m[1];
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix2f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix2f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}